

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::initializeLegacyChannelRules(DwaCompressor *this)

{
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *this_00;
  allocator<char> local_359;
  Classifier local_358;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  this_00 = &this->_channelRules;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  clear(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"r",&local_359);
  Classifier::Classifier(&local_358,&local_28,LOSSY_DCT,HALF,0,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"r",&local_359);
  Classifier::Classifier(&local_358,&local_48,LOSSY_DCT,FLOAT,0,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"red",&local_359);
  Classifier::Classifier(&local_358,&local_68,LOSSY_DCT,HALF,0,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"red",&local_359);
  Classifier::Classifier(&local_358,&local_88,LOSSY_DCT,FLOAT,0,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"g",&local_359);
  Classifier::Classifier(&local_358,&local_a8,LOSSY_DCT,HALF,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"g",&local_359);
  Classifier::Classifier(&local_358,&local_c8,LOSSY_DCT,FLOAT,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"grn",&local_359);
  Classifier::Classifier(&local_358,&local_e8,LOSSY_DCT,HALF,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"grn",&local_359);
  Classifier::Classifier(&local_358,&local_108,LOSSY_DCT,FLOAT,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"green",&local_359);
  Classifier::Classifier(&local_358,&local_128,LOSSY_DCT,HALF,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"green",&local_359);
  Classifier::Classifier(&local_358,&local_148,LOSSY_DCT,FLOAT,1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"b",&local_359);
  Classifier::Classifier(&local_358,&local_168,LOSSY_DCT,HALF,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"b",&local_359);
  Classifier::Classifier(&local_358,&local_188,LOSSY_DCT,FLOAT,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"blu",&local_359);
  Classifier::Classifier(&local_358,&local_1a8,LOSSY_DCT,HALF,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"blu",&local_359);
  Classifier::Classifier(&local_358,&local_1c8,LOSSY_DCT,FLOAT,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"blue",&local_359);
  Classifier::Classifier(&local_358,&local_1e8,LOSSY_DCT,HALF,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"blue",&local_359);
  Classifier::Classifier(&local_358,&local_208,LOSSY_DCT,FLOAT,2,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"y",&local_359);
  Classifier::Classifier(&local_358,&local_228,LOSSY_DCT,HALF,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"y",&local_359);
  Classifier::Classifier(&local_358,&local_248,LOSSY_DCT,FLOAT,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"by",&local_359);
  Classifier::Classifier(&local_358,&local_268,LOSSY_DCT,HALF,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"by",&local_359);
  Classifier::Classifier(&local_358,&local_288,LOSSY_DCT,FLOAT,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"ry",&local_359);
  Classifier::Classifier(&local_358,&local_2a8,LOSSY_DCT,HALF,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"ry",&local_359);
  Classifier::Classifier(&local_358,&local_2c8,LOSSY_DCT,FLOAT,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"a",&local_359);
  Classifier::Classifier(&local_358,&local_2e8,RLE,UINT,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"a",&local_359);
  Classifier::Classifier(&local_358,&local_308,RLE,HALF,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"a",&local_359);
  Classifier::Classifier(&local_358,&local_328,RLE,FLOAT,-1,true);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  emplace_back<Imf_2_5::DwaCompressor::Classifier>(this_00,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_328);
  return;
}

Assistant:

void
DwaCompressor::initializeLegacyChannelRules ()
{
    _channelRules.clear();

    _channelRules.push_back (Classifier ("r",     LOSSY_DCT, HALF,   0, true));
    _channelRules.push_back (Classifier ("r",     LOSSY_DCT, FLOAT,  0, true));
    _channelRules.push_back (Classifier ("red",   LOSSY_DCT, HALF,   0, true));
    _channelRules.push_back (Classifier ("red",   LOSSY_DCT, FLOAT,  0, true));
    _channelRules.push_back (Classifier ("g",     LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("g",     LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("grn",   LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("grn",   LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("green", LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("green", LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("b",     LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("b",     LOSSY_DCT, FLOAT,  2, true));
    _channelRules.push_back (Classifier ("blu",   LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("blu",   LOSSY_DCT, FLOAT,  2, true));
    _channelRules.push_back (Classifier ("blue",  LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("blue",  LOSSY_DCT, FLOAT,  2, true));

    _channelRules.push_back (Classifier ("y",     LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("y",     LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("by",    LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("by",    LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("ry",    LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("ry",    LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       UINT,  -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       HALF,  -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       FLOAT, -1, true));
}